

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.hpp
# Opt level: O2

ValueProxy * LLVMBC::cast<LLVMBC::ValueProxy>(Value *value)

{
  ValueKind VVar1;
  LoggingCallback p_Var2;
  void *pvVar3;
  char buffer [4096];
  
  VVar1 = Value::get_value_kind(value);
  if (VVar1 == Proxy) {
    return (ValueProxy *)value;
  }
  p_Var2 = dxil_spv::get_thread_log_callback();
  if (p_Var2 == (LoggingCallback)0x0) {
    fwrite("[ERROR]: Invalid type ID in cast<T>.\n",0x25,1,_stderr);
    fflush(_stderr);
    std::terminate();
  }
  builtin_strncpy(buffer + 0x10,"in cast<T>.\n",0xd);
  builtin_strncpy(buffer,"Invalid type ID ",0x10);
  pvVar3 = dxil_spv::get_thread_log_callback_userdata();
  (*p_Var2)(pvVar3,Error,buffer);
  std::terminate();
}

Assistant:

inline const T *cast(const Value *value)
{
	if (T::get_value_kind() != ValueKind::Proxy)
		value = Internal::resolve_proxy(value);

	if (T::is_base_of_value_kind(value->get_value_kind()))
		return static_cast<const T *>(value);
	else
	{
		LOGE("Invalid type ID in cast<T>.\n");
		std::terminate();
	}
}